

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void get_text_data_bss(GlobalVars *gv,LinkedSection **sections)

{
  char *pcVar1;
  char *errtxt;
  LinkedSection *pLVar2;
  
  pLVar2 = (LinkedSection *)&gv->lnksec;
  sections[2] = (LinkedSection *)0x0;
  *sections = (LinkedSection *)0x0;
  sections[1] = (LinkedSection *)0x0;
LAB_00110a0a:
  do {
    pLVar2 = (LinkedSection *)(pLVar2->n).next;
    if ((pLVar2->n).next == (node *)0x0) {
      return;
    }
  } while ((pLVar2->flags & 1) == 0);
  switch((ulong)pLVar2->type) {
  case 0:
    pLVar2->flags = pLVar2->flags & 0xfe;
    goto LAB_00110a0a;
  case 1:
    if (*sections == (LinkedSection *)0x0) {
      *sections = pLVar2;
      goto LAB_00110a0a;
    }
    pcVar1 = pLVar2->name;
    errtxt = "%sMultiple code sections (%s)";
    break;
  case 2:
    if (sections[1] == (LinkedSection *)0x0) {
      sections[1] = pLVar2;
      goto LAB_00110a0a;
    }
    pcVar1 = pLVar2->name;
    errtxt = "%sMultiple data sections (%s)";
    break;
  case 3:
    if (sections[2] == (LinkedSection *)0x0) {
      sections[2] = pLVar2;
      goto LAB_00110a0a;
    }
    pcVar1 = pLVar2->name;
    errtxt = "%sMultiple bss sections (%s)";
    break;
  default:
    goto switchD_00110a32_default;
  }
  ierror(errtxt,"get_text_data_bss(): ",pcVar1);
  goto LAB_00110a0a;
switchD_00110a32_default:
  ierror("%sIllegal section type %d (%s)","get_text_data_bss(): ",(ulong)pLVar2->type,pLVar2->name);
  goto LAB_00110a0a;
}

Assistant:

void get_text_data_bss(struct GlobalVars *gv,struct LinkedSection **sections)
/* find exactly one ST_CODE, ST_DATA and ST_UDATA section, which
   will become .text, .data and .bss */
{
  static const char *fn = "get_text_data_bss(): ";
  struct LinkedSection *ls;

  sections[0] = sections[1] = sections[2] = NULL;
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      switch (ls->type) {
        case ST_UNDEFINED:
          /* @@@ discard undefined sections - they are empty anyway */
          ls->flags &= ~SF_ALLOC;
          break;
        case ST_CODE:
          if (sections[0]==NULL)
            sections[0] = ls;
          else
            ierror("%sMultiple code sections (%s)",fn,ls->name);
          break;
        case ST_DATA:
          if (sections[1]==NULL)
            sections[1] = ls;
          else
            ierror("%sMultiple data sections (%s)",fn,ls->name);
          break;
        case ST_UDATA:
          if (sections[2]==NULL)
            sections[2] = ls;
          else
            ierror("%sMultiple bss sections (%s)",fn,ls->name);
          break;
        default:
          ierror("%sIllegal section type %d (%s)",fn,(int)ls->type,ls->name);
          break;
      }
    }
  }
}